

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall icu_63::ChineseCalendar::inDaylightTime(ChineseCalendar *this,UErrorCode *status)

{
  int iVar1;
  TimeZone *pTVar2;
  
  if (U_ZERO_ERROR < *status) {
    return '\0';
  }
  pTVar2 = Calendar::getTimeZone(&this->super_Calendar);
  iVar1 = (*(pTVar2->super_UObject)._vptr_UObject[9])(pTVar2);
  if (((char)iVar1 != '\0') &&
     (Calendar::complete(&this->super_Calendar,status), *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    return (this->super_Calendar).fFields[0x10] != 0;
  }
  return '\0';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }